

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groups.hpp
# Opt level: O2

void __thiscall
Args::AllOfGroup::checkCorrectnessBeforeParsing
          (AllOfGroup *this,StringList *flags,StringList *names)

{
  pointer puVar1;
  int iVar2;
  BaseException *this_00;
  pointer puVar3;
  allocator local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  GroupIface::checkCorrectnessBeforeParsing(&this->super_GroupIface,flags,names);
  puVar3 = (this->super_GroupIface).m_children.
           super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->super_GroupIface).m_children.
           super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (puVar3 == puVar1) {
      return;
    }
    iVar2 = (*((puVar3->_M_t).
               super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
               super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
               super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl)->_vptr_ArgIface[5])();
    if ((char)iVar2 != '\0') break;
    puVar3 = puVar3 + 1;
  }
  this_00 = (BaseException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_e0,"Required argument \"",&local_121);
  (*((puVar3->_M_t).super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>.
     _M_t.super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
     super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl)->_vptr_ArgIface[3])(&local_100);
  std::operator+(&local_c0,&local_e0,&local_100);
  std::operator+(&local_a0,&local_c0,"\" is not allowed to ");
  std::operator+(&local_80,&local_a0,"be in AllOf group \"");
  std::__cxx11::string::string((string *)&local_120,(string *)&(this->super_GroupIface).m_name);
  std::operator+(&local_60,&local_80,&local_120);
  std::operator+(&local_40,&local_60,"\".");
  BaseException::BaseException(this_00,&local_40);
  __cxa_throw(this_00,&BaseException::typeinfo,BaseException::~BaseException);
}

Assistant:

void checkCorrectnessBeforeParsing(
		//! All known flags.
		StringList & flags,
		//! All known names.
		StringList & names ) const override
	{
		GroupIface::checkCorrectnessBeforeParsing( flags, names );

		for( const auto & arg : details::asConst( children() ) )
		{
			if( arg->isRequired() )
				throw BaseException( String( SL( "Required argument \"" ) ) +
					arg->name() +
					SL( "\" is not allowed to " ) +
					SL( "be in AllOf group \"" ) + name() + SL( "\"." ) );
		}
	}